

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_patternmodifier.cpp
# Opt level: O2

void __thiscall
icu_63::number::impl::MutablePatternModifier::processQuantity
          (MutablePatternModifier *this,DecimalQuantity *fq,MicroProps *micros,UErrorCode *status)

{
  bool bVar1;
  int8_t iVar2;
  Form FVar3;
  DecimalQuantity copy;
  DecimalQuantity local_80;
  
  (*this->fParent->_vptr_MicroPropsGenerator[2])();
  bVar1 = needsPlurals(this);
  if (bVar1) {
    DecimalQuantity::DecimalQuantity(&local_80,fq);
    RoundingImpl::apply(&micros->rounder,&local_80,status);
    iVar2 = DecimalQuantity::signum(fq);
    FVar3 = utils::getStandardPlural(this->fRules,&local_80.super_IFixedDecimal);
    this->fSignum = iVar2;
    this->fPlural = FVar3;
    DecimalQuantity::~DecimalQuantity(&local_80);
  }
  else {
    iVar2 = DecimalQuantity::signum(fq);
    this->fSignum = iVar2;
    this->fPlural = COUNT;
  }
  micros->modMiddle = &this->super_Modifier;
  return;
}

Assistant:

void MutablePatternModifier::processQuantity(DecimalQuantity& fq, MicroProps& micros,
                                             UErrorCode& status) const {
    fParent->processQuantity(fq, micros, status);
    // The unsafe code path performs self-mutation, so we need a const_cast.
    // This method needs to be const because it overrides a const method in the parent class.
    auto nonConstThis = const_cast<MutablePatternModifier*>(this);
    if (needsPlurals()) {
        // TODO: Fix this. Avoid the copy.
        DecimalQuantity copy(fq);
        micros.rounder.apply(copy, status);
        nonConstThis->setNumberProperties(fq.signum(), utils::getStandardPlural(fRules, copy));
    } else {
        nonConstThis->setNumberProperties(fq.signum(), StandardPlural::Form::COUNT);
    }
    micros.modMiddle = this;
}